

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCommandLine.cpp
# Opt level: O0

void __thiscall tcu::DebugOutStreambuf::DebugOutStreambuf(DebugOutStreambuf *this)

{
  DebugOutStreambuf *this_local;
  
  std::streambuf::streambuf(this);
  *(undefined ***)this = &PTR__DebugOutStreambuf_011e8440;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&this->m_curLine);
  return;
}

Assistant:

DebugOutStreambuf::DebugOutStreambuf (void)
{
}